

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Logger::configure(Logger *this,Configurations *configurations)

{
  Configurations *this_00;
  bool bVar1;
  TypedConfigurations *this_01;
  
  this->m_isConfigured = false;
  initUnflushedCount(this);
  if (this->m_typedConfigurations != (TypedConfigurations *)0x0) {
    bVar1 = Configurations::hasConfiguration
                      (this->m_typedConfigurations->m_configurations,Global,Filename);
    if (bVar1) {
      flush(this);
    }
  }
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])(this);
  this_00 = &this->m_configurations;
  bVar1 = base::utils::
          AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
          ::operator!=((AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)this_00,
                       (AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)configurations);
  if (bVar1) {
    Configurations::setFromBase(this_00,configurations);
  }
  base::utils::safeDelete<el::base::TypedConfigurations>(&this->m_typedConfigurations);
  this_01 = (TypedConfigurations *)operator_new(0x200);
  base::TypedConfigurations::TypedConfigurations(this_01,this_00,this->m_logStreamsReference);
  this->m_typedConfigurations = this_01;
  resolveLoggerFormatSpec(this);
  this->m_isConfigured = true;
  return;
}

Assistant:

void Logger::configure(const Configurations& configurations) {
  m_isConfigured = false;  // we set it to false in case if we fail
  initUnflushedCount();
  if (m_typedConfigurations != nullptr) {
    Configurations* c = const_cast<Configurations*>(m_typedConfigurations->configurations());
    if (c->hasConfiguration(Level::Global, ConfigurationType::Filename)) {
      // This check is definitely needed for cases like ELPP_NO_DEFAULT_LOG_FILE
      flush();
    }
  }
  base::threading::ScopedLock scopedLock(lock());
  if (m_configurations != configurations) {
    m_configurations.setFromBase(const_cast<Configurations*>(&configurations));
  }
  base::utils::safeDelete(m_typedConfigurations);
  m_typedConfigurations = new base::TypedConfigurations(&m_configurations, m_logStreamsReference);
  resolveLoggerFormatSpec();
  m_isConfigured = true;
}